

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::setOffset(Assembler *this,size_t offset)

{
  CodeEmitter *this_00;
  char *message;
  unsigned_long *puVar1;
  CodeEmitter *in_RSI;
  long in_RDI;
  size_t length;
  Error error;
  Error local_20;
  
  if (*(int *)(in_RDI + 0x2c) == 0) {
    error = (Error)((ulong)*(undefined8 *)(*(long *)(in_RDI + 0x80) + 0x40) >> 0x20);
    message = (char *)(*(long *)(in_RDI + 0x98) - *(long *)(in_RDI + 0x88));
    puVar1 = std::max<unsigned_long>
                       ((unsigned_long *)&stack0xffffffffffffffc0,
                        (unsigned_long *)&stack0xffffffffffffffb8);
    this_00 = (CodeEmitter *)*puVar1;
    if (this_00 < in_RSI) {
      local_20 = CodeEmitter::setLastError(this_00,error,message);
    }
    else {
      if (*(CodeEmitter **)(*(long *)(in_RDI + 0x80) + 0x40) < this_00) {
        *(CodeEmitter **)(*(long *)(in_RDI + 0x80) + 0x40) = this_00;
      }
      *(long *)(in_RDI + 0x98) = (long)&in_RSI->_vptr_CodeEmitter + *(long *)(in_RDI + 0x88);
      local_20 = 0;
    }
  }
  else {
    local_20 = *(Error *)(in_RDI + 0x2c);
  }
  return local_20;
}

Assistant:

Error Assembler::setOffset(size_t offset) {
  if (_lastError) return _lastError;

  size_t length = std::max(_section->getBuffer().getLength(), getOffset());
  if (ASMJIT_UNLIKELY(offset > length))
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  // If the `Assembler` generated any code the `_bufferPtr` may be higher than
  // the section length stored in `CodeHolder` as it doesn't update it each
  // time it generates machine code. This is the same as calling `sync()`.
  if (_section->_buffer._length < length)
    _section->_buffer._length = length;

  _bufferPtr = _bufferData + offset;
  return kErrorOk;
}